

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

int __thiscall efsw::String::compare(String *this,size_t pos1,size_t n1,char *s)

{
  int iVar1;
  String local_48;
  char *local_28;
  char *s_local;
  size_t n1_local;
  size_t pos1_local;
  String *this_local;
  
  local_28 = s;
  s_local = (char *)n1;
  n1_local = pos1;
  pos1_local = (size_t)this;
  String(&local_48,s);
  iVar1 = compare(this,pos1,n1,&local_48);
  ~String(&local_48);
  return iVar1;
}

Assistant:

int String::compare ( std::size_t pos1, std::size_t n1, const char* s) const
{
	return compare( pos1, n1, String( s ) );
}